

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

size_t __thiscall RPCHelpMan::GetParamIndex(RPCHelpMan *this,string_view key)

{
  RPCArg *pRVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> __it;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> _Var4;
  long in_FS_OFFSET;
  size_t local_50;
  char *local_48;
  size_t *local_40;
  long local_38;
  
  local_48 = key._M_str;
  local_50 = key._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &local_50;
  __it._M_current =
       (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
       super__Vector_impl_data._M_start;
  pRVar1 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = ((long)pRVar1 - (long)__it._M_current >> 3) * 0xf83e0f83e0f83e1 >> 2;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                            *)&local_40,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_006d4e96;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                            *)&local_40,__it._M_current + 1);
      _Var4._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_006d4e96;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                            *)&local_40,__it._M_current + 2);
      _Var4._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_006d4e96;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                            *)&local_40,__it._M_current + 3);
      _Var4._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_006d4e96;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pRVar1 - (long)__it._M_current >> 3) * 0xf83e0f83e0f83e1;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = pRVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
                  ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_006d4e96;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_006d4e96;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
          ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                        *)&local_40,__it);
  _Var4._M_current = pRVar1;
  if (bVar2) {
    _Var4._M_current = __it._M_current;
  }
LAB_006d4e96:
  local_40 = (size_t *)
             CONCAT71(local_40._1_7_,
                      _Var4._M_current !=
                      (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  inline_check_non_fatal<bool>
            ((bool *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
             ,0x305,"GetParamIndex","it != m_args.end()");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return ((long)_Var4._M_current -
          (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
}

Assistant:

size_t RPCHelpMan::GetParamIndex(std::string_view key) const
{
    auto it{std::find_if(
        m_args.begin(), m_args.end(), [&key](const auto& arg) { return arg.GetName() == key;}
    )};

    CHECK_NONFATAL(it != m_args.end());  // TODO: ideally this is checked at compile time
    return std::distance(m_args.begin(), it);
}